

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMControlDependenceAnalysisImpl.h
# Opt level: O0

void __thiscall
dg::LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
          (LLVMControlDependenceAnalysisImpl *this,Module *module,
          LLVMControlDependenceAnalysisOptions *opts)

{
  LLVMControlDependenceAnalysisOptions *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  LLVMControlDependenceAnalysisOptions *in_stack_ffffffffffffffd8;
  
  *in_RDI = &PTR__LLVMControlDependenceAnalysisImpl_001b9b20;
  in_RDI[1] = in_RSI;
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
            (in_RDX,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

LLVMControlDependenceAnalysisImpl(const llvm::Module *module,
                                      LLVMControlDependenceAnalysisOptions opts)
            : _module(module), _options(std::move(opts)) {}